

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O2

int send_http_sas_request
              (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_client,
              HTTPAPIEX_HANDLE http_api_handle,char *relative_path,
              HTTP_HEADERS_HANDLE request_header,BUFFER_HANDLE blobBuffer,
              BUFFER_HANDLE response_buff)

{
  HTTPAPIEX_RESULT HVar1;
  char *uriResource;
  char *key;
  HTTPAPIEX_SAS_HANDLE sasHandle;
  LOGGER_LOG p_Var2;
  int iVar3;
  uint statusCode;
  BUFFER_HANDLE local_40;
  STRING_HANDLE local_38;
  
  local_38 = STRING_construct_sprintf
                       ("%s/devices/%s",upload_client->hostname,upload_client->deviceId);
  if (local_38 == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x6b;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"send_http_sas_request",0x6a,1,"Failure constructing uri string");
    }
  }
  else {
    local_40 = response_buff;
    uriResource = STRING_c_str(local_38);
    key = IoTHubClient_Auth_Get_DeviceKey(upload_client->authorization_module);
    sasHandle = HTTPAPIEX_SAS_Create_From_String(key,uriResource,"");
    if (sasHandle == (HTTPAPIEX_SAS_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar3 = 0x75;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"send_http_sas_request",0x74,1,"unable to HTTPAPIEX_SAS_Create");
      }
    }
    else {
      statusCode = 0;
      HVar1 = HTTPAPIEX_SAS_ExecuteRequest
                        (sasHandle,http_api_handle,HTTPAPI_REQUEST_POST,relative_path,request_header
                         ,blobBuffer,&statusCode,(HTTP_HEADERS_HANDLE)0x0,local_40);
      if (HVar1 == HTTPAPIEX_OK) {
        iVar3 = 0;
        if (199 < statusCode - 100) {
          p_Var2 = xlogging_get_log_function();
          iVar3 = 0x85;
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"send_http_sas_request",0x84,1,"HTTP failed response code was %u",
                      (ulong)statusCode);
          }
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar3 = 0x80;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"send_http_sas_request",0x7f,1,"unable to HTTPAPIEX_SAS_ExecuteRequest");
        }
      }
      HTTPAPIEX_SAS_Destroy(sasHandle);
    }
    STRING_delete(local_38);
  }
  return iVar3;
}

Assistant:

static int send_http_sas_request(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_client, HTTPAPIEX_HANDLE http_api_handle, const char* relative_path, HTTP_HEADERS_HANDLE request_header, BUFFER_HANDLE blobBuffer, BUFFER_HANDLE response_buff)
{
    int result;
    STRING_HANDLE uri_resource = STRING_construct_sprintf("%s/devices/%s", upload_client->hostname, upload_client->deviceId);

    if (uri_resource == NULL)
    {
        LogError("Failure constructing uri string");
        result = MU_FAILURE;
    }
    else
    {
        const char* uriResourceCharPtr = STRING_c_str(uri_resource);
        HTTPAPIEX_SAS_HANDLE http_sas_handle = HTTPAPIEX_SAS_Create_From_String(IoTHubClient_Auth_Get_DeviceKey(upload_client->authorization_module), uriResourceCharPtr, EMPTY_STRING);

        if (http_sas_handle == NULL)
        {
            LogError("unable to HTTPAPIEX_SAS_Create");
            result = MU_FAILURE;
        }
        else
        {
            unsigned int statusCode = 0;

            if (HTTPAPIEX_SAS_ExecuteRequest(
                http_sas_handle, http_api_handle, HTTPAPI_REQUEST_POST, relative_path, request_header,
                blobBuffer, &statusCode, NULL, response_buff) != HTTPAPIEX_OK)
            {
                LogError("unable to HTTPAPIEX_SAS_ExecuteRequest");
                result = MU_FAILURE;
            }
            else if (!IS_HTTP_STATUS_CODE_SUCCESS(statusCode))
            {
                LogError("HTTP failed response code was %u", statusCode);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            HTTPAPIEX_SAS_Destroy(http_sas_handle);
        }

        STRING_delete(uri_resource);
    }

    return result;
}